

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullseat.c
# Opt level: O3

SeatDialogPromptDescriptions * nullseat_prompt_descriptions(Seat *seat)

{
  return &nullseat_prompt_descriptions::descs;
}

Assistant:

const SeatDialogPromptDescriptions *nullseat_prompt_descriptions(Seat *seat)
{
    static const SeatDialogPromptDescriptions descs = {
        .hk_accept_action = "",
        .hk_connect_once_action = "",
        .hk_cancel_action = "",
        .hk_cancel_action_Participle = "",
    };
    return &descs;
}